

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_console.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  IConfig *pIVar7;
  allocator local_49;
  string local_48 [55];
  Colour local_11;
  ConsoleReporter *pCStack_10;
  Colour colour;
  ConsoleReporter *this_local;
  
  pCStack_10 = this;
  poVar4 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  pcVar5 = getLineOfChars<(char)126>();
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\n");
  Colour::Colour(&local_11,FileName);
  poVar4 = (this->super_StreamingReporterBase).stream;
  psVar6 = (string *)
           Option<Catch::TestRunInfo>::operator->
                     (&(this->super_StreamingReporterBase).currentTestRunInfo.
                       super_Option<Catch::TestRunInfo>);
  poVar4 = std::operator<<(poVar4,psVar6);
  poVar4 = std::operator<<(poVar4," is a Catch v");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,libraryVersion);
  poVar4 = std::operator<<(poVar4,".");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,DAT_002035ac);
  poVar4 = std::operator<<(poVar4," b");
  std::ostream::operator<<(poVar4,DAT_002035b0);
  pcVar5 = DAT_002035b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"master",&local_49);
  bVar1 = std::operator!=(pcVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar1) {
    poVar4 = std::operator<<((this->super_StreamingReporterBase).stream," (");
    poVar4 = std::operator<<(poVar4,DAT_002035b8);
    std::operator<<(poVar4,")");
  }
  poVar4 = std::operator<<((this->super_StreamingReporterBase).stream," host application.\n");
  std::operator<<(poVar4,"Run with -? for options\n\n");
  pIVar7 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
  iVar2 = (*(pIVar7->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
  if (iVar2 != 0) {
    poVar4 = std::operator<<((this->super_StreamingReporterBase).stream,"Randomness seeded to: ");
    pIVar7 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
    uVar3 = (*(pIVar7->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
    std::operator<<(poVar4,"\n\n");
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(&local_11);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }